

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O1

uint64_t helper_neon_addl_saturate_s32_arm(CPUARMState *env,uint64_t a,uint64_t b)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t y;
  uint32_t x;
  uint uVar4;
  
  uVar4 = (uint)a;
  uVar3 = (uint)b + uVar4;
  if (-1 < (int)((uint)b ^ uVar4) && (int)(uVar3 ^ uVar4) < 0) {
    (env->vfp).qc[0] = 1;
    uVar3 = ((uint)(a >> 0x1f) & 1) + 0x7fffffff;
  }
  uVar4 = (uint)(b >> 0x20);
  uVar1 = (uint)(a >> 0x20);
  uVar2 = uVar4 + uVar1;
  if (-1 < (int)(uVar4 ^ uVar1) && (int)(uVar2 ^ uVar1) < 0) {
    (env->vfp).qc[0] = 1;
    uVar2 = ((long)a < 0) + 0x7fffffff;
  }
  return CONCAT44(uVar2,uVar3);
}

Assistant:

uint64_t HELPER(neon_addl_saturate_s32)(CPUARMState *env, uint64_t a, uint64_t b)
{
    uint32_t x, y;
    uint32_t low, high;

    x = a;
    y = b;
    low = x + y;
    if (((low ^ x) & SIGNBIT) && !((x ^ y) & SIGNBIT)) {
        SET_QC();
        low = ((int32_t)x >> 31) ^ ~SIGNBIT;
    }
    x = a >> 32;
    y = b >> 32;
    high = x + y;
    if (((high ^ x) & SIGNBIT) && !((x ^ y) & SIGNBIT)) {
        SET_QC();
        high = ((int32_t)x >> 31) ^ ~SIGNBIT;
    }
    return low | ((uint64_t)high << 32);
}